

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelVoidsElement::~IfcRelVoidsElement(IfcRelVoidsElement *this)

{
  ~IfcRelVoidsElement((IfcRelVoidsElement *)
                      &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.
                       field_2);
  return;
}

Assistant:

IfcRelVoidsElement() : Object("IfcRelVoidsElement") {}